

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfInputSetFrameBuffer(ImfInputFile *in,ImfRgba *base,size_t xStride,size_t yStride)

{
  Imf_3_2::RgbaInputFile::setFrameBuffer((RgbaInputFile *)in,(Rgba *)base,xStride,yStride);
  return 1;
}

Assistant:

int
ImfInputSetFrameBuffer (
    ImfInputFile* in, ImfRgba* base, size_t xStride, size_t yStride)
{
    try
    {
        infile (in)->setFrameBuffer (
            (OPENEXR_IMF_INTERNAL_NAMESPACE::Rgba*) base, xStride, yStride);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}